

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O1

void __thiscall Omega_h::filesystem::IteratorImpl::increment(IteratorImpl *this)

{
  int iVar1;
  int *piVar2;
  dirent *pdVar3;
  filesystem_error *this_00;
  char *in_RSI;
  
  do {
    do {
      iVar1 = (int)in_RSI;
      piVar2 = __errno_location();
      *piVar2 = 0;
      pdVar3 = readdir((DIR *)this->stream);
      this->entry = (dirent *)pdVar3;
      if (pdVar3 == (dirent *)0x0) {
        if (*piVar2 == 0) {
          close(this,iVar1);
          return;
        }
        this_00 = (filesystem_error *)__cxa_allocate_exception(0x20);
        filesystem_error::filesystem_error(this_00,*piVar2,"directory_iterator");
        __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      in_RSI = ".";
      iVar1 = strcmp(pdVar3->d_name,".");
    } while (iVar1 == 0);
    in_RSI = "..";
    iVar1 = strcmp(pdVar3->d_name,"..");
  } while (iVar1 == 0);
  return;
}

Assistant:

void increment() {
    errno = 0;
    entry = ::readdir(stream);
    if (entry == nullptr) {
      if (errno != 0) {
        throw filesystem_error(errno, "directory_iterator");
      }
      // safely reached the end of the directory
      close();
    } else {
      // we just extracted a good entry from the stream
      // skip dot and dot-dot, max 3-call recursion
      if (0 == strcmp(entry->d_name, "."))
        increment();
      else if (0 == strcmp(entry->d_name, ".."))
        increment();
    }
  }